

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::MergeValidityLoop
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  void *__dest_00;
  uint uVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  sel_t *psVar6;
  row_t rVar7;
  void *__dest_01;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  bool bVar21;
  undefined1 uVar22;
  bool result_values [2048];
  sel_t result_ids [2048];
  undefined1 local_2838 [2048];
  uint local_2038 [2050];
  
  FlatVector::VerifyFlatVector(base_data);
  pSVar3 = update->sel;
  lVar10 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar1 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar1 * 4);
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  lVar11 = (ulong)update_info->max * 4;
  if (count == 0) {
    sVar13 = 0;
    uVar18 = 0;
  }
  else {
    psVar4 = sel->sel_vector;
    uVar19 = (ulong)update_info->N;
    uVar14 = (ulong)base_info->N;
    puVar5 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar18 = 0;
    uVar8 = 0;
    sVar13 = 0;
    uVar9 = 0;
    do {
      uVar12 = uVar8;
      if (psVar4 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar4[uVar8];
      }
      uVar15 = ids[uVar12] - lVar10;
      bVar21 = uVar18 < uVar19;
      uVar12 = uVar9;
      if (bVar21) {
        uVar16 = (ulong)*(uint *)((long)&update_info[1].segment + uVar18 * 4);
        if (uVar16 < uVar15) {
          lVar17 = 0;
          do {
            local_2838[lVar17 + sVar13] =
                 *(undefined1 *)((long)&update_info[1].segment + lVar17 + uVar18 + lVar11);
            local_2038[sVar13 + lVar17] = (uint)uVar16;
            if ((1 - uVar19) + uVar18 + lVar17 == 0) {
              sVar13 = sVar13 + lVar17 + 1;
              uVar18 = uVar18 + 1 + lVar17;
              goto LAB_017c8c27;
            }
            uVar16 = (ulong)*(uint *)((long)&update_info[1].segment + lVar17 * 4 + uVar18 * 4 + 4);
            lVar17 = lVar17 + 1;
          } while (uVar16 < uVar15);
          uVar18 = uVar18 + lVar17;
          bVar21 = uVar18 < uVar19;
          sVar13 = sVar13 + lVar17;
        }
        if ((!bVar21) || (uVar15 != uVar16)) goto LAB_017c8c27;
        local_2838[sVar13] = *(undefined1 *)((long)__dest_01 + uVar18);
        local_2038[sVar13] = (uint)uVar16;
        uVar18 = uVar18 + 1;
      }
      else {
LAB_017c8c27:
        bVar21 = uVar9 < uVar14;
        if (bVar21) {
          uVar16 = (ulong)*(uint *)((long)&__dest->segment + uVar9 * 4);
          if (uVar16 < uVar15) {
            do {
              uVar12 = uVar14;
              if (uVar14 - 1 == uVar9) goto LAB_017c8c72;
              uVar16 = (ulong)*(uint *)((long)&base_info[1].segment + uVar9 * 4 + 4);
              uVar9 = uVar9 + 1;
            } while (uVar16 < uVar15);
            bVar21 = uVar9 < uVar14;
          }
          uVar12 = uVar9;
          if ((!bVar21) || (uVar15 != uVar16)) goto LAB_017c8c72;
          uVar22 = *(undefined1 *)((long)__dest_00 + uVar9);
        }
        else {
LAB_017c8c72:
          if (puVar5 == (unsigned_long *)0x0) {
            uVar22 = 1;
          }
          else {
            uVar22 = (puVar5[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0;
          }
        }
        local_2838[sVar13] = uVar22;
        local_2038[sVar13] = (uint)uVar15;
      }
      sVar13 = sVar13 + 1;
      uVar8 = uVar8 + 1;
      uVar9 = uVar12;
    } while (uVar8 != count);
  }
  uVar9 = (ulong)update_info->N;
  sVar20 = uVar9 - uVar18;
  if (uVar18 <= uVar9 && sVar20 != 0) {
    switchD_012e1ce8::default
              (local_2838 + sVar13,(void *)((long)&update_info[1].segment + lVar11 + uVar18),sVar20)
    ;
    switchD_012e1ce8::default
              (local_2038 + sVar13,(void *)((long)&update_info[1].segment + uVar18 * 4),sVar20 * 4);
    sVar13 = (sVar13 - uVar18) + uVar9;
  }
  update_info->N = (sel_t)sVar13;
  switchD_012e1ce8::default(__dest_01,local_2838,sVar13);
  switchD_012e1ce8::default(update_info + 1,local_2038,sVar13 << 2);
  uVar18 = (ulong)base_info->N;
  if (count == 0 || uVar18 == 0) {
    sVar13 = 0;
    uVar19 = 0;
    uVar9 = 0;
  }
  else {
    psVar4 = sel->sel_vector;
    psVar6 = pSVar3->sel_vector;
    puVar5 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    sVar13 = 0;
    uVar9 = 0;
    uVar19 = 0;
    do {
      uVar8 = uVar9;
      if (psVar4 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar4[uVar9];
      }
      uVar14 = ids[uVar8] - lVar10;
      uVar2 = *(uint *)((long)&__dest->segment + uVar19 * 4);
      if (uVar14 == uVar2) {
        if (psVar6 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar6[uVar8];
        }
        if (puVar5 == (unsigned_long *)0x0) {
          bVar21 = true;
        }
        else {
          bVar21 = (puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0;
        }
        local_2838[sVar13] = bVar21;
        local_2038[sVar13] = (uint)uVar14;
        uVar9 = uVar9 + 1;
LAB_017c8e27:
        uVar19 = uVar19 + 1;
      }
      else {
        if (uVar2 <= uVar14) {
          local_2838[sVar13] = *(undefined1 *)((long)__dest_00 + uVar19);
          local_2038[sVar13] = uVar2;
          goto LAB_017c8e27;
        }
        if (psVar6 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar6[uVar8];
        }
        if (puVar5 == (unsigned_long *)0x0) {
          bVar21 = true;
        }
        else {
          bVar21 = (puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0;
        }
        local_2838[sVar13] = bVar21;
        local_2038[sVar13] = (uint)uVar14;
        uVar9 = uVar9 + 1;
      }
      sVar13 = sVar13 + 1;
    } while ((uVar9 < count) && (uVar19 < uVar18));
  }
  if (uVar9 < count) {
    psVar4 = sel->sel_vector;
    psVar6 = pSVar3->sel_vector;
    puVar5 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    do {
      uVar8 = uVar9;
      if (psVar4 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar4[uVar9];
      }
      uVar14 = uVar8;
      if (psVar6 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar6[uVar8];
      }
      if (puVar5 == (unsigned_long *)0x0) {
        bVar21 = true;
      }
      else {
        bVar21 = (puVar5[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0;
      }
      rVar7 = ids[uVar8];
      local_2838[sVar13] = bVar21;
      local_2038[sVar13] = (int)rVar7 - (int)lVar10;
      sVar13 = sVar13 + 1;
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  sVar20 = uVar18 - uVar19;
  if (uVar19 <= uVar18 && sVar20 != 0) {
    switchD_012e1ce8::default
              (local_2838 + sVar13,(void *)((long)&base_info[1].segment + (ulong)uVar1 * 4 + uVar19)
               ,sVar20);
    switchD_012e1ce8::default
              (local_2038 + sVar13,(void *)((long)&base_info[1].segment + uVar19 * 4),sVar20 * 4);
    sVar13 = sVar13 + sVar20;
  }
  base_info->N = (sel_t)sVar13;
  switchD_012e1ce8::default(__dest_00,local_2838,sVar13);
  switchD_012e1ce8::default(__dest,local_2038,sVar13 << 2);
  return;
}

Assistant:

static void MergeValidityLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                              UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto &base_validity = FlatVector::Validity(base_data);
	auto &update_validity = update.validity;
	MergeUpdateLoopInternal<bool, ValidityMask, ExtractValidityEntry>(base_info, &base_validity, update_info,
	                                                                  *update.sel, &update_validity, ids, count, sel);
}